

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  uint uVar40;
  uint uVar41;
  uint uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  int local_143c;
  RTCIntersectArguments *local_1438;
  long local_1430;
  ulong local_1428;
  Geometry *local_1420;
  long local_1418;
  long local_1410;
  ulong local_1408;
  ulong *local_1400;
  RayQueryContext *local_13f8;
  Scene *local_13f0;
  undefined4 local_13e8;
  undefined4 local_13e4;
  undefined4 local_13e0;
  undefined4 local_13dc;
  undefined4 local_13d8;
  undefined4 local_13d4;
  uint local_13d0;
  uint local_13cc;
  uint local_13c8;
  RTCFilterFunctionNArguments local_13b8;
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1358 [16];
  byte local_1347;
  float local_1338 [4];
  undefined1 local_1328 [16];
  float local_1318 [4];
  undefined1 local_1308 [16];
  undefined1 local_12f8 [16];
  undefined1 local_12e8 [16];
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8 [565];
  
  local_11d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8[0] != 8) {
    if (0.0 <= ray->tfar) {
      local_1400 = local_11d8 + 1;
      aVar2 = (ray->dir).field_0.field_1;
      auVar21 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar18._8_4_ = 0x7fffffff;
      auVar18._0_8_ = 0x7fffffff7fffffff;
      auVar18._12_4_ = 0x7fffffff;
      auVar18 = vandps_avx512vl((undefined1  [16])aVar2,auVar18);
      auVar37._8_4_ = 0x219392ef;
      auVar37._0_8_ = 0x219392ef219392ef;
      auVar37._12_4_ = 0x219392ef;
      uVar14 = vcmpps_avx512vl(auVar18,auVar37,1);
      bVar4 = (bool)((byte)uVar14 & 1);
      auVar19._0_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * (int)aVar2.x;
      bVar4 = (bool)((byte)(uVar14 >> 1) & 1);
      auVar19._4_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * (int)aVar2.y;
      bVar4 = (bool)((byte)(uVar14 >> 2) & 1);
      auVar19._8_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * (int)aVar2.z;
      bVar4 = (bool)((byte)(uVar14 >> 3) & 1);
      auVar19._12_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * aVar2.field_3.a;
      auVar18 = vrcp14ps_avx512vl(auVar19);
      auVar20._8_4_ = 0x3f800000;
      auVar20._0_8_ = 0x3f8000003f800000;
      auVar20._12_4_ = 0x3f800000;
      auVar20 = vfnmadd213ps_avx512vl(auVar19,auVar18,auVar20);
      auVar19 = vfmadd132ps_fma(auVar20,auVar18,auVar18);
      auVar29 = vbroadcastss_avx512vl(auVar19);
      auVar46 = ZEXT3264(auVar29);
      auVar18 = vmovshdup_avx(auVar19);
      auVar29 = vbroadcastsd_avx512vl(auVar18);
      auVar47 = ZEXT3264(auVar29);
      auVar20 = vshufpd_avx(auVar19,auVar19,1);
      auVar30._8_4_ = 2;
      auVar30._0_8_ = 0x200000002;
      auVar30._12_4_ = 2;
      auVar30._16_4_ = 2;
      auVar30._20_4_ = 2;
      auVar30._24_4_ = 2;
      auVar30._28_4_ = 2;
      auVar29 = vpermps_avx512vl(auVar30,ZEXT1632(auVar19));
      auVar48 = ZEXT3264(auVar29);
      fVar33 = auVar19._0_4_ * (ray->org).field_0.m128[0];
      auVar38._4_4_ = fVar33;
      auVar38._0_4_ = fVar33;
      auVar38._8_4_ = fVar33;
      auVar38._12_4_ = fVar33;
      auVar38._16_4_ = fVar33;
      auVar38._20_4_ = fVar33;
      auVar38._24_4_ = fVar33;
      auVar38._28_4_ = fVar33;
      auVar29._8_4_ = 1;
      auVar29._0_8_ = 0x100000001;
      auVar29._12_4_ = 1;
      auVar29._16_4_ = 1;
      auVar29._20_4_ = 1;
      auVar29._24_4_ = 1;
      auVar29._28_4_ = 1;
      auVar31 = ZEXT1632(CONCAT412(auVar19._12_4_ * (ray->org).field_0.m128[3],
                                   CONCAT48(auVar19._8_4_ * (ray->org).field_0.m128[2],
                                            CONCAT44(auVar19._4_4_ * (ray->org).field_0.m128[1],
                                                     fVar33))));
      auVar29 = vpermps_avx2(auVar29,auVar31);
      auVar31 = vpermps_avx2(auVar30,auVar31);
      local_1408 = (ulong)(auVar19._0_4_ < 0.0) << 5;
      uVar15 = (ulong)(auVar18._0_4_ < 0.0) << 5 | 0x40;
      uVar14 = (ulong)(auVar20._0_4_ < 0.0) << 5 | 0x80;
      uVar16 = local_1408 ^ 0x20;
      auVar32._8_4_ = 0x80000000;
      auVar32._0_8_ = 0x8000000080000000;
      auVar32._12_4_ = 0x80000000;
      auVar32._16_4_ = 0x80000000;
      auVar32._20_4_ = 0x80000000;
      auVar32._24_4_ = 0x80000000;
      auVar32._28_4_ = 0x80000000;
      auVar30 = vxorps_avx512vl(auVar38,auVar32);
      auVar49 = ZEXT3264(auVar30);
      auVar29 = vxorps_avx512vl(auVar29,auVar32);
      auVar50 = ZEXT3264(auVar29);
      auVar29 = vxorps_avx512vl(auVar31,auVar32);
      auVar51 = ZEXT3264(auVar29);
      auVar29 = vbroadcastss_avx512vl(auVar21);
      auVar52 = ZEXT3264(auVar29);
      auVar29 = vbroadcastss_avx512vl(ZEXT416((uint)ray->tfar));
      auVar53 = ZEXT3264(auVar29);
      auVar21 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar54 = ZEXT1664(auVar21);
      auVar21 = vmovddup_avx512vl(ZEXT816(0x8000000080000000));
      auVar55 = ZEXT1664(auVar21);
      auVar21 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
      auVar56 = ZEXT1664(auVar21);
      auVar21 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar57 = ZEXT1664(auVar21);
      local_13f8 = context;
LAB_01c572a7:
      if (local_1400 != local_11d8) {
        uVar17 = local_1400[-1];
        local_1400 = local_1400 + -1;
        while ((uVar17 & 8) == 0) {
          auVar29 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar17 + 0x40 + local_1408),auVar49._0_32_,
                               auVar46._0_32_);
          auVar31 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar17 + 0x40 + uVar15),auVar50._0_32_,
                               auVar47._0_32_);
          auVar29 = vpmaxsd_avx2(auVar29,auVar31);
          auVar31 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar17 + 0x40 + uVar14),auVar51._0_32_,
                               auVar48._0_32_);
          auVar31 = vpmaxsd_avx512vl(auVar31,auVar52._0_32_);
          auVar29 = vpmaxsd_avx2(auVar29,auVar31);
          auVar31 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar17 + 0x40 + uVar16),auVar49._0_32_,
                               auVar46._0_32_);
          auVar30 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar17 + 0x40 + (uVar15 ^ 0x20)),
                               auVar50._0_32_,auVar47._0_32_);
          auVar31 = vpminsd_avx2(auVar31,auVar30);
          auVar30 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar17 + 0x40 + (uVar14 ^ 0x20)),
                               auVar51._0_32_,auVar48._0_32_);
          auVar30 = vpminsd_avx512vl(auVar30,auVar53._0_32_);
          auVar31 = vpminsd_avx2(auVar31,auVar30);
          uVar12 = vpcmpd_avx512vl(auVar29,auVar31,2);
          if ((char)uVar12 == '\0') goto LAB_01c572a7;
          uVar10 = uVar17 & 0xfffffffffffffff0;
          lVar13 = 0;
          for (uVar17 = uVar12; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
            lVar13 = lVar13 + 1;
          }
          uVar17 = *(ulong *)(uVar10 + lVar13 * 8);
          uVar11 = (uint)uVar12 - 1 & (uint)uVar12;
          uVar12 = (ulong)uVar11;
          if (uVar11 != 0) {
            do {
              *local_1400 = uVar17;
              local_1400 = local_1400 + 1;
              lVar13 = 0;
              for (uVar17 = uVar12; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
                lVar13 = lVar13 + 1;
              }
              uVar12 = uVar12 - 1 & uVar12;
              uVar17 = *(ulong *)(uVar10 + lVar13 * 8);
            } while (uVar12 != 0);
          }
        }
        local_1410 = (ulong)((uint)uVar17 & 0xf) - 8;
        uVar17 = uVar17 & 0xfffffffffffffff0;
        for (local_1418 = 0; local_1418 != local_1410; local_1418 = local_1418 + 1) {
          lVar13 = local_1418 * 0xb0;
          auVar21 = *(undefined1 (*) [16])(uVar17 + 0x80 + lVar13);
          auVar18 = *(undefined1 (*) [16])(uVar17 + 0x40 + lVar13);
          auVar20 = *(undefined1 (*) [16])(uVar17 + 0x70 + lVar13);
          auVar19 = *(undefined1 (*) [16])(uVar17 + 0x50 + lVar13);
          auVar22._0_4_ = auVar18._0_4_ * auVar21._0_4_;
          auVar22._4_4_ = auVar18._4_4_ * auVar21._4_4_;
          auVar22._8_4_ = auVar18._8_4_ * auVar21._8_4_;
          auVar22._12_4_ = auVar18._12_4_ * auVar21._12_4_;
          auVar37 = *(undefined1 (*) [16])(uVar17 + 0x60 + lVar13);
          auVar3 = *(undefined1 (*) [16])(uVar17 + 0x30 + lVar13);
          local_1308 = vfmsub231ps_fma(auVar22,auVar20,auVar19);
          auVar26._0_4_ = auVar19._0_4_ * auVar37._0_4_;
          auVar26._4_4_ = auVar19._4_4_ * auVar37._4_4_;
          auVar26._8_4_ = auVar19._8_4_ * auVar37._8_4_;
          auVar26._12_4_ = auVar19._12_4_ * auVar37._12_4_;
          local_12f8 = vfmsub231ps_fma(auVar26,auVar21,auVar3);
          auVar27._0_4_ = auVar3._0_4_ * auVar20._0_4_;
          auVar27._4_4_ = auVar3._4_4_ * auVar20._4_4_;
          auVar27._8_4_ = auVar3._8_4_ * auVar20._8_4_;
          auVar27._12_4_ = auVar3._12_4_ * auVar20._12_4_;
          uVar1 = *(undefined4 *)&(ray->dir).field_0;
          auVar43._4_4_ = uVar1;
          auVar43._0_4_ = uVar1;
          auVar43._8_4_ = uVar1;
          auVar43._12_4_ = uVar1;
          uVar1 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
          auVar44._4_4_ = uVar1;
          auVar44._0_4_ = uVar1;
          auVar44._8_4_ = uVar1;
          auVar44._12_4_ = uVar1;
          fVar33 = (ray->dir).field_0.m128[2];
          auVar28._4_4_ = fVar33;
          auVar28._0_4_ = fVar33;
          auVar28._8_4_ = fVar33;
          auVar28._12_4_ = fVar33;
          uVar1 = *(undefined4 *)&(ray->org).field_0;
          auVar25._4_4_ = uVar1;
          auVar25._0_4_ = uVar1;
          auVar25._8_4_ = uVar1;
          auVar25._12_4_ = uVar1;
          auVar22 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar17 + lVar13),auVar25);
          local_12e8 = vfmsub231ps_fma(auVar27,auVar37,auVar18);
          uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
          auVar23._4_4_ = uVar1;
          auVar23._0_4_ = uVar1;
          auVar23._8_4_ = uVar1;
          auVar23._12_4_ = uVar1;
          auVar23 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar17 + 0x10 + lVar13),auVar23);
          uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
          auVar24._4_4_ = uVar1;
          auVar24._0_4_ = uVar1;
          auVar24._8_4_ = uVar1;
          auVar24._12_4_ = uVar1;
          auVar24 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar17 + 0x20 + lVar13),auVar24);
          auVar25 = vmulps_avx512vl(auVar44,auVar24);
          auVar26 = vfmsub231ps_avx512vl(auVar25,auVar23,auVar28);
          auVar25 = vmulps_avx512vl(auVar28,auVar22);
          auVar27 = vfmsub231ps_avx512vl(auVar25,auVar24,auVar43);
          auVar25 = vmulps_avx512vl(auVar43,auVar23);
          auVar28 = vfmsub231ps_avx512vl(auVar25,auVar22,auVar44);
          auVar45._0_4_ = fVar33 * local_12e8._0_4_;
          auVar45._4_4_ = fVar33 * local_12e8._4_4_;
          auVar45._8_4_ = fVar33 * local_12e8._8_4_;
          auVar45._12_4_ = fVar33 * local_12e8._12_4_;
          auVar25 = vfmadd231ps_fma(auVar45,local_12f8,auVar44);
          auVar25 = vfmadd231ps_fma(auVar25,local_1308,auVar43);
          local_1358 = vandps_avx512vl(auVar25,auVar54._0_16_);
          auVar21 = vmulps_avx512vl(auVar21,auVar28);
          auVar21 = vfmadd231ps_avx512vl(auVar21,auVar27,auVar20);
          auVar21 = vfmadd231ps_avx512vl(auVar21,auVar26,auVar37);
          auVar20 = vandps_avx512vl(auVar25,auVar55._0_16_);
          uVar11 = auVar20._0_4_;
          local_1388._0_4_ = (float)(uVar11 ^ auVar21._0_4_);
          uVar40 = auVar20._4_4_;
          local_1388._4_4_ = (float)(uVar40 ^ auVar21._4_4_);
          uVar41 = auVar20._8_4_;
          local_1388._8_4_ = (float)(uVar41 ^ auVar21._8_4_);
          uVar42 = auVar20._12_4_;
          local_1388._12_4_ = (float)(uVar42 ^ auVar21._12_4_);
          auVar21 = vmulps_avx512vl(auVar19,auVar28);
          auVar21 = vfmadd231ps_avx512vl(auVar21,auVar18,auVar27);
          auVar21 = vfmadd231ps_avx512vl(auVar21,auVar3,auVar26);
          local_1378._0_4_ = (float)(uVar11 ^ auVar21._0_4_);
          local_1378._4_4_ = (float)(uVar40 ^ auVar21._4_4_);
          local_1378._8_4_ = (float)(uVar41 ^ auVar21._8_4_);
          local_1378._12_4_ = (float)(uVar42 ^ auVar21._12_4_);
          auVar21 = auVar56._0_16_;
          uVar5 = vcmpps_avx512vl(local_1388,auVar21,5);
          uVar6 = vcmpps_avx512vl(local_1378,auVar21,5);
          uVar7 = vcmpps_avx512vl(auVar25,auVar21,4);
          auVar21._0_4_ = local_1388._0_4_ + local_1378._0_4_;
          auVar21._4_4_ = local_1388._4_4_ + local_1378._4_4_;
          auVar21._8_4_ = local_1388._8_4_ + local_1378._8_4_;
          auVar21._12_4_ = local_1388._12_4_ + local_1378._12_4_;
          uVar8 = vcmpps_avx512vl(auVar21,local_1358,2);
          local_1347 = (byte)uVar5 & (byte)uVar6 & (byte)uVar7 & (byte)uVar8;
          if (local_1347 != 0) {
            auVar39._0_4_ = auVar24._0_4_ * local_12e8._0_4_;
            auVar39._4_4_ = auVar24._4_4_ * local_12e8._4_4_;
            auVar39._8_4_ = auVar24._8_4_ * local_12e8._8_4_;
            auVar39._12_4_ = auVar24._12_4_ * local_12e8._12_4_;
            auVar21 = vfmadd213ps_fma(auVar23,local_12f8,auVar39);
            auVar21 = vfmadd213ps_fma(auVar22,local_1308,auVar21);
            local_1368._0_4_ = (float)(uVar11 ^ auVar21._0_4_);
            local_1368._4_4_ = (float)(uVar40 ^ auVar21._4_4_);
            local_1368._8_4_ = (float)(uVar41 ^ auVar21._8_4_);
            local_1368._12_4_ = (float)(uVar42 ^ auVar21._12_4_);
            uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
            auVar3._4_4_ = uVar1;
            auVar3._0_4_ = uVar1;
            auVar3._8_4_ = uVar1;
            auVar3._12_4_ = uVar1;
            auVar21 = vmulps_avx512vl(local_1358,auVar3);
            fVar33 = ray->tfar;
            auVar9._4_4_ = fVar33;
            auVar9._0_4_ = fVar33;
            auVar9._8_4_ = fVar33;
            auVar9._12_4_ = fVar33;
            auVar18 = vmulps_avx512vl(local_1358,auVar9);
            uVar5 = vcmpps_avx512vl(local_1368,auVar18,2);
            uVar6 = vcmpps_avx512vl(auVar21,local_1368,1);
            local_1347 = (byte)uVar5 & (byte)uVar6 & local_1347;
            if (local_1347 != 0) {
              local_13f0 = local_13f8->scene;
              auVar21 = vrcp14ps_avx512vl(local_1358);
              auVar18 = vfnmadd213ps_avx512vl(local_1358,auVar21,auVar57._0_16_);
              auVar21 = vfmadd132ps_fma(auVar18,auVar21,auVar21);
              fVar33 = auVar21._0_4_;
              fVar34 = auVar21._4_4_;
              fVar35 = auVar21._8_4_;
              fVar36 = auVar21._12_4_;
              local_1318[0] = fVar33 * local_1368._0_4_;
              local_1318[1] = fVar34 * local_1368._4_4_;
              local_1318[2] = fVar35 * local_1368._8_4_;
              local_1318[3] = fVar36 * local_1368._12_4_;
              local_1338[0] = fVar33 * local_1388._0_4_;
              local_1338[1] = fVar34 * local_1388._4_4_;
              local_1338[2] = fVar35 * local_1388._8_4_;
              local_1338[3] = fVar36 * local_1388._12_4_;
              local_1328._0_4_ = fVar33 * local_1378._0_4_;
              local_1328._4_4_ = fVar34 * local_1378._4_4_;
              local_1328._8_4_ = fVar35 * local_1378._8_4_;
              local_1328._12_4_ = fVar36 * local_1378._12_4_;
              local_1428 = (ulong)local_1347;
              local_1430 = lVar13 + uVar17;
              do {
                auVar21 = auVar56._0_16_;
                uVar12 = 0;
                for (uVar10 = local_1428; (uVar10 & 1) == 0;
                    uVar10 = uVar10 >> 1 | 0x8000000000000000) {
                  uVar12 = uVar12 + 1;
                }
                local_13d0 = *(uint *)(local_1430 + 0x90 + uVar12 * 4);
                local_1420 = (local_13f0->geometries).items[local_13d0].ptr;
                if ((local_1420->mask & ray->mask) == 0) {
                  local_1428 = local_1428 ^ 1L << (uVar12 & 0x3f);
                }
                else {
                  if ((local_13f8->args->filter == (RTCFilterFunctionN)0x0) &&
                     (local_1420->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01c578ae:
                    ray->tfar = -INFINITY;
                    return;
                  }
                  local_1438 = local_13f8->args;
                  local_12d8 = auVar53._0_32_;
                  local_12b8 = auVar52._0_32_;
                  local_1298 = auVar51._0_32_;
                  local_1278 = auVar50._0_32_;
                  local_1258 = auVar49._0_32_;
                  local_1238 = auVar48._0_32_;
                  local_1218 = auVar47._0_32_;
                  local_11f8 = auVar46._0_32_;
                  uVar10 = (ulong)(uint)((int)uVar12 * 4);
                  local_13b8.context = local_13f8->user;
                  local_13e8 = *(undefined4 *)(local_1308 + uVar10);
                  local_13e4 = *(undefined4 *)(local_12f8 + uVar10);
                  local_13e0 = *(undefined4 *)(local_12e8 + uVar10);
                  local_13dc = *(undefined4 *)((long)local_1338 + uVar10);
                  local_13d8 = *(undefined4 *)(local_1328 + uVar10);
                  local_13d4 = *(undefined4 *)(local_1430 + 0xa0 + uVar10);
                  local_13cc = (local_13b8.context)->instID[0];
                  local_13c8 = (local_13b8.context)->instPrimID[0];
                  fVar33 = ray->tfar;
                  ray->tfar = *(float *)((long)local_1318 + uVar10);
                  local_143c = -1;
                  local_13b8.valid = &local_143c;
                  local_13b8.geometryUserPtr = local_1420->userPtr;
                  local_13b8.hit = (RTCHitN *)&local_13e8;
                  local_13b8.N = 1;
                  local_13b8.ray = (RTCRayN *)ray;
                  if (((local_1420->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                      ((*local_1420->occlusionFilterN)(&local_13b8), *local_13b8.valid != 0)) &&
                     ((local_1438->filter == (RTCFilterFunctionN)0x0 ||
                      ((((local_1438->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT &&
                        (((local_1420->field_8).field_0x2 & 0x40) == 0)) ||
                       ((*local_1438->filter)(&local_13b8), *local_13b8.valid != 0))))))
                  goto LAB_01c578ae;
                  ray->tfar = fVar33;
                  local_1428 = local_1428 ^ 1L << (uVar12 & 0x3f);
                  auVar46 = ZEXT3264(local_11f8);
                  auVar47 = ZEXT3264(local_1218);
                  auVar48 = ZEXT3264(local_1238);
                  auVar49 = ZEXT3264(local_1258);
                  auVar50 = ZEXT3264(local_1278);
                  auVar51 = ZEXT3264(local_1298);
                  auVar52 = ZEXT3264(local_12b8);
                  auVar53 = ZEXT3264(local_12d8);
                  auVar18 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar54 = ZEXT1664(auVar18);
                  auVar18 = vmovddup_avx512vl(ZEXT816(0x8000000080000000));
                  auVar55 = ZEXT1664(auVar18);
                  auVar21 = vxorps_avx512vl(auVar21,auVar21);
                  auVar56 = ZEXT1664(auVar21);
                  auVar21 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar57 = ZEXT1664(auVar21);
                }
              } while (local_1428 != 0);
            }
          }
        }
        goto LAB_01c572a7;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }